

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineInputAssemblyTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::InputAssemblyInstance::iterate
          (TestStatus *__return_storage_ptr__,InputAssemblyInstance *this)

{
  pointer puVar1;
  TestLog *log;
  bool bVar2;
  VkResult VVar3;
  PrimitiveType primitive;
  deUint32 queueFamilyIndex;
  DeviceInterface *pDVar4;
  VkDevice pVVar5;
  VkQueue pVVar6;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  size_t i;
  ulong uVar7;
  ulong uVar8;
  size_t i_1;
  TextureFormat tcuColorFormat;
  TextureFormat tcuStencilFormat;
  UniquePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> result;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> nonIndexedVertices
  ;
  IVec3 local_614;
  undefined1 *local_608;
  undefined1 *puStack_600;
  ColorVertexShader vertexShader;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indicesRange;
  Program program;
  ColorFragmentShader fragmentShader;
  ReferenceRenderer refRenderer;
  RenderState renderState;
  VkSubmitInfo submitInfo;
  
  pDVar4 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar5 = Context::getDevice((this->super_TestInstance).m_context);
  pVVar6 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&this->m_cmdBuffer;
  VVar3 = (*pDVar4->_vptr_DeviceInterface[0x14])(pDVar4,pVVar5,1,&this->m_fence);
  ::vk::checkResult(VVar3,"vk.resetFences(vkDevice, 1, &m_fence.get())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineInputAssemblyTests.cpp"
                    ,0x5a3);
  VVar3 = (*pDVar4->_vptr_DeviceInterface[2])
                    (pDVar4,pVVar6,1,&submitInfo,
                     (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
                     m_internal);
  ::vk::checkResult(VVar3,"vk.queueSubmit(queue, 1, &submitInfo, *m_fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineInputAssemblyTests.cpp"
                    ,0x5a4);
  VVar3 = (*pDVar4->_vptr_DeviceInterface[0x16])
                    (pDVar4,pVVar5,1,&this->m_fence,1,0xffffffffffffffff);
  ::vk::checkResult(VVar3,"vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineInputAssemblyTests.cpp"
                    ,0x5a5);
  tcuColorFormat = ::vk::mapVkFormat(this->m_colorFormat);
  tcuStencilFormat.order = CHANNELORDER_LAST;
  tcuStencilFormat.type = CHANNELTYPE_LAST;
  ColorVertexShader::ColorVertexShader((ColorVertexShader *)&vertexShader.super_VertexShader);
  ColorFragmentShader::ColorFragmentShader(&fragmentShader,&tcuColorFormat,&tcuStencilFormat);
  program.geometryShader = (GeometryShader *)0x0;
  program.vertexShader = &vertexShader.super_VertexShader;
  program.fragmentShader = &fragmentShader.super_FragmentShader;
  ReferenceRenderer::ReferenceRenderer
            (&refRenderer,(this->m_renderSize).m_data[0],(this->m_renderSize).m_data[1],1,
             &tcuColorFormat,&tcuStencilFormat,&program);
  primitive = mapVkPrimitiveTopology(this->m_primitiveTopology);
  ReferenceRenderer::getViewportState(&refRenderer);
  rr::RenderState::RenderState
            (&renderState,(ViewportState *)&indicesRange,VIEWPORTORIENTATION_LOWER_LEFT);
  if (this->m_primitiveTopology == VK_PRIMITIVE_TOPOLOGY_POINT_LIST) {
    renderState.point.pointSize = 3.0;
  }
  if (this->m_primitiveRestartEnable == true) {
    indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (uVar8 = 0;
        puVar1 = (this->m_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start,
        uVar8 < (ulong)((long)(this->m_indices).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2);
        uVar8 = uVar8 + 1) {
      if ((-(uint)(this->m_indexType == VK_INDEX_TYPE_UINT32) | 0xffff) == puVar1[uVar8]) {
LAB_00505042:
        nonIndexedVertices.
        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        nonIndexedVertices.
        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        nonIndexedVertices.
        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        for (uVar7 = 0;
            uVar7 < (ulong)((long)indicesRange.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)indicesRange.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 2); uVar7 = uVar7 + 1)
        {
          std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
          push_back((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                     *)&nonIndexedVertices.
                        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ,(this->m_vertices).
                     super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                     ._M_impl.super__Vector_impl_data._M_start +
                     indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar7]);
        }
        ReferenceRenderer::draw
                  (&refRenderer,&renderState,primitive,
                   (vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    *)&nonIndexedVertices.
                       super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                  );
        if (indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        std::_Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        ~_Vector_base(&nonIndexedVertices.
                       super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                     );
      }
      else {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&indicesRange,puVar1 + uVar8);
        if (uVar8 == ((long)(this->m_indices).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(this->m_indices).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2) - 1U) goto LAB_00505042;
      }
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  else {
    indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (uVar8 = 0;
        puVar1 = (this->m_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start,
        uVar8 < (ulong)((long)(this->m_indices).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2);
        uVar8 = uVar8 + 1) {
      std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
      push_back((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
                &indicesRange,
                (this->m_vertices).
                super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                ._M_impl.super__Vector_impl_data._M_start + puVar1[uVar8]);
    }
    ReferenceRenderer::draw
              (&refRenderer,&renderState,primitive,
               (vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
               &indicesRange);
    std::_Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
    ~_Vector_base((_Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                   *)&indicesRange);
  }
  pDVar4 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar5 = Context::getDevice((this->super_TestInstance).m_context);
  pVVar6 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  vk = Context::getInstanceInterface((this->super_TestInstance).m_context);
  physicalDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)&indicesRange,vk,physicalDevice);
  ::vk::SimpleAllocator::SimpleAllocator
            ((SimpleAllocator *)&renderState,pDVar4,pVVar5,
             (VkPhysicalDeviceMemoryProperties *)&indicesRange);
  readColorAttachment((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                      &indicesRange,pDVar4,pVVar5,pVVar6,queueFamilyIndex,(Allocator *)&renderState,
                      (VkImage)(this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                               m_data.object.m_internal,this->m_colorFormat,&this->m_renderSize);
  puVar1 = indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  indicesRange.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.ptr =
       (TextureLevel *)puVar1;
  de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::~UniqueBase
            ((UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)&indicesRange)
  ;
  log = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  ReferenceRenderer::getAccess((PixelBufferAccess *)&indicesRange,&refRenderer);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&nonIndexedVertices,(TextureLevel *)puVar1);
  local_608 = &DAT_200000002;
  puStack_600 = &DAT_200000002;
  local_614.m_data[0] = 1;
  local_614.m_data[1] = 1;
  local_614.m_data[2] = 0;
  bVar2 = tcu::intThresholdPositionDeviationCompare
                    (log,"IntImageCompare","Image comparison",
                     (ConstPixelBufferAccess *)&indicesRange,
                     (ConstPixelBufferAccess *)&nonIndexedVertices,(UVec4 *)&local_608,&local_614,
                     true,COMPARE_LOG_RESULT);
  de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::~UniqueBase
            (&result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&renderState,"Result image matches reference",
               (allocator<char> *)&indicesRange);
    tcu::TestStatus::pass(__return_storage_ptr__,(string *)&renderState);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&renderState,"Image mismatch",(allocator<char> *)&indicesRange);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&renderState);
  }
  std::__cxx11::string::~string((string *)&renderState);
  ReferenceRenderer::~ReferenceRenderer(&refRenderer);
  rr::FragmentShader::~FragmentShader(&fragmentShader.super_FragmentShader);
  rr::VertexShader::~VertexShader(&vertexShader.super_VertexShader);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus InputAssemblyInstance::iterate (void)
{
	const DeviceInterface&		vk			= m_context.getDeviceInterface();
	const VkDevice				vkDevice	= m_context.getDevice();
	const VkQueue				queue		= m_context.getUniversalQueue();
	const VkSubmitInfo			submitInfo	=
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
		DE_NULL,						// const void*				pNext;
		0u,								// deUint32					waitSemaphoreCount;
		DE_NULL,						// const VkSemaphore*		pWaitSemaphores;
		(const VkPipelineStageFlags*)DE_NULL,
		1u,								// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),				// const VkCommandBuffer*	pCommandBuffers;
		0u,								// deUint32					signalSemaphoreCount;
		DE_NULL							// const VkSemaphore*		pSignalSemaphores;
	};

	VK_CHECK(vk.resetFences(vkDevice, 1, &m_fence.get()));
	VK_CHECK(vk.queueSubmit(queue, 1, &submitInfo, *m_fence));
	VK_CHECK(vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) /* infinity*/));

	return verifyImage();
}